

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkStringTemplate
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeStrTemplate *pnode,Context context)

{
  bool bVar1;
  ResultType local_21;
  ResultType result;
  Context context_local;
  ParseNodeStrTemplate *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  if ((pnode->field_0x2a & 1) == 0) {
    if (pnode->pnodeSubstitutionExpressions == (ParseNodePtr)0x0) {
      local_21 = WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                           ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                            pnode->pnodeStringLiterals,context);
    }
    else {
      local_21 = WalkList(this,&pnode->super_ParseNode,&pnode->pnodeSubstitutionExpressions,context)
      ;
      bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                        (&this->super_WalkerPolicyTest,local_21);
      if (bVar1) {
        local_21 = WalkList(this,&pnode->super_ParseNode,&pnode->pnodeStringLiterals,context);
      }
    }
  }
  else {
    local_21 = WalkList(this,&pnode->super_ParseNode,&pnode->pnodeStringLiterals,context);
  }
  return local_21;
}

Assistant:

ResultType WalkStringTemplate(ParseNodeStrTemplate *pnode, Context context)
    {
        ResultType result;

        if (!pnode->isTaggedTemplate)
        {
            if (pnode->pnodeSubstitutionExpressions == nullptr)
            {
                // If we don't have any substitution expressions, then we should only have one string literal and not a list
                result = WalkNode(pnode->pnodeStringLiterals, context);
            }
            else
            {
                result = WalkList(pnode, pnode->pnodeSubstitutionExpressions, context);
                if (ContinueWalk(result))
                {
                    result = WalkList(pnode, pnode->pnodeStringLiterals, context);
                }
            }
        }
        else
        {
            result = WalkList(pnode, pnode->pnodeStringLiterals, context);
        }

        return result;
    }